

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void __thiscall JSONTest_Stringify_Test::TestBody(JSONTest_Stringify_Test *this)

{
  char *curr;
  char *pcVar1;
  stringstream local_1f0 [8];
  stringstream ss;
  undefined1 local_1e0 [376];
  undefined1 local_68 [8];
  Value value;
  char *input;
  internal local_28 [8];
  AssertionResult gtest_ar;
  
  value.field_1.str.str._M_str = "[\"hello\",\"world\"]";
  curr = strdup("[\"hello\",\"world\"]");
  local_68._0_4_ = Null;
  value.type = String;
  value._4_4_ = 0;
  json::Value::parse((Value *)local_68,curr,ASCII);
  std::__cxx11::stringstream::stringstream(local_1f0);
  json::Value::stringify((ostream *)local_68,SUB81(local_1e0,0));
  std::__cxx11::stringbuf::str();
  pcVar1 = "ss.str()";
  testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
            (local_28,"ss.str()","input",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,
             (char **)((long)&value.field_1 + 8));
  std::__cxx11::string::~string((string *)&input);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&input);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/json.cpp"
               ,0xe,pcVar1);
    pcVar1 = (char *)&input;
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,(Message *)pcVar1)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (input != (char *)0x0) {
      (**(code **)(*(long *)input + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  free(curr);
  std::__cxx11::stringstream::~stringstream(local_1f0);
  json::Value::free((Value *)local_68,pcVar1);
  return;
}

Assistant:

TEST_F(JSONTest, Stringify) {
  // TODO: change the API to not require a copy
  auto input = "[\"hello\",\"world\"]";
  auto* copy = strdup(input);
  json::Value value;
  value.parse(copy, json::Value::ASCII);
  std::stringstream ss;
  value.stringify(ss);
  EXPECT_EQ(ss.str(), input);
  free(copy);
}